

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSetFrameQpRealtime::PostEncodeFrameHook
          (DatarateTestSetFrameQpRealtime *this,Encoder *encoder)

{
  bool bVar1;
  AssertHelper *this_00;
  int *in_RDI;
  int *unaff_retaddr;
  int in_stack_0000000c;
  Encoder *in_stack_00000010;
  Message *in_stack_00000018;
  AssertHelper *in_stack_00000020;
  AssertionResult gtest_ar;
  int qp;
  int *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  Type in_stack_ffffffffffffffcc;
  AssertHelper *in_stack_ffffffffffffffd0;
  AssertionResult local_28;
  undefined4 local_14;
  
  if (in_RDI[0x136] < in_RDI[0x134]) {
    local_14 = 0;
    libaom_test::Encoder::Control(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI,
               in_stack_ffffffffffffffa0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffffd0);
      this_00 = (AssertHelper *)
                testing::AssertionResult::failure_message((AssertionResult *)0x793cbb);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffbc,
                 (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      testing::internal::AssertHelper::operator=(in_stack_00000020,in_stack_00000018);
      testing::internal::AssertHelper::~AssertHelper(this_00);
      testing::Message::~Message((Message *)0x793d09);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x793d69);
  }
  return;
}

Assistant:

void PostEncodeFrameHook(::libaom_test::Encoder *encoder) override {
    if (frame_ >= total_frames_) return;
    int qp = 0;
    encoder->Control(AOME_GET_LAST_QUANTIZER_64, &qp);
    ASSERT_EQ(qp, frame_qp_);
  }